

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_VerifyBeforeCertRequest_Test::
~SSLVersionTest_VerifyBeforeCertRequest_Test(SSLVersionTest_VerifyBeforeCertRequest_Test *this)

{
  anon_unknown_0::SSLVersionTest_VerifyBeforeCertRequest_Test::
  ~SSLVersionTest_VerifyBeforeCertRequest_Test
            ((SSLVersionTest_VerifyBeforeCertRequest_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(SSLVersionTest, VerifyBeforeCertRequest) {
  // Configure the server to request client certificates.
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Configure the client to reject the server certificate.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_invalid; });

  // cert_cb should not be called. Verification should fail first.
  SSL_CTX_set_cert_cb(
      client_ctx_.get(),
      [](SSL *ssl, void *arg) {
        ADD_FAILURE() << "cert_cb unexpectedly called";
        return 0;
      },
      nullptr);

  bssl::UniquePtr<SSL> client, server;
  EXPECT_FALSE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                      server_ctx_.get()));
}